

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_config.c
# Opt level: O0

int mk_config_listen_parse(char *value,mk_server *server)

{
  int iVar1;
  mk_list *pmVar2;
  char *pcVar3;
  int *piVar4;
  long lVar5;
  mk_list *__mptr;
  mk_string_line *listener;
  mk_list *list;
  char *divider;
  char *port;
  char *address;
  long port_num;
  int flags;
  int ret;
  mk_server *server_local;
  char *value_local;
  
  port_num._4_4_ = -1;
  port = (char *)0x0;
  divider = (char *)0x0;
  listener = (mk_string_line *)mk_string_split_line(value);
  if ((listener == (mk_string_line *)0x0) ||
     (iVar1 = mk_list_is_empty((mk_list *)listener), iVar1 == 0)) goto LAB_001087ee;
  pmVar2 = *(mk_list **)&listener->len + -1;
  if (*(char *)&pmVar2->prev->prev == '[') {
    pcVar3 = strchr((char *)pmVar2->prev,0x5d);
    if (pcVar3 == (char *)0x0) {
      mk_print(0x1001,"[config] Expected closing \']\' in IPv6 address.");
      goto LAB_001087ee;
    }
    if ((pcVar3[1] != ':') || (pcVar3[2] == '\0')) {
      mk_print(0x1001,"[config] Expected \':port\' after IPv6 address.");
      goto LAB_001087ee;
    }
    port = mk_string_copy_substr
                     ((char *)((long)&pmVar2->prev->prev + 1),0,
                      ((int)pcVar3 - (int)pmVar2->prev) + -1);
    divider = mk_string_dup(pcVar3 + 2);
  }
  else {
    pcVar3 = strchr((char *)pmVar2->prev,0x3a);
    if (pcVar3 == (char *)0x0) {
      port = (char *)0x0;
      divider = mk_string_dup((char *)pmVar2->prev);
    }
    else {
      pcVar3 = strrchr((char *)pmVar2->prev,0x3a);
      if ((pcVar3 == (char *)0x0) || (pcVar3[1] == '\0')) {
        mk_print(0x1001,"[config] Expected \':port\' after IPv4 address.");
        goto LAB_001087ee;
      }
      port = mk_string_copy_substr((char *)pmVar2->prev,0,(int)pcVar3 - (int)pmVar2->prev);
      divider = mk_string_dup(pcVar3 + 1);
    }
  }
  piVar4 = __errno_location();
  *piVar4 = 0;
  lVar5 = strtol(divider,(char **)0x0,10);
  piVar4 = __errno_location();
  if (((*piVar4 != 0) || (lVar5 == 0x7fffffffffffffff)) || (lVar5 == -0x8000000000000000)) {
    mk_print(0x1002,"Using defaults, could not understand \"Listen %s\"",pmVar2->prev);
    divider = (char *)0x0;
  }
  port_num._0_4_ = 1;
  iVar1 = mk_config_key_have((mk_list *)listener,"!http");
  if (iVar1 != 0) {
    port_num._0_4_ = 0xffffffff;
  }
  iVar1 = mk_config_key_have((mk_list *)listener,"tls");
  if (iVar1 != 0) {
    port_num._0_4_ = (uint)port_num | 8;
  }
  mk_config_listener_add(port,divider,(uint)port_num,server);
  mk_string_split_free((mk_list *)listener);
  listener = (mk_string_line *)0x0;
  port_num._4_4_ = 0;
LAB_001087ee:
  if (port != (char *)0x0) {
    mk_mem_free(port);
  }
  if (divider != (char *)0x0) {
    mk_mem_free(divider);
  }
  if (listener != (mk_string_line *)0x0) {
    mk_string_split_free((mk_list *)listener);
  }
  return port_num._4_4_;
}

Assistant:

int mk_config_listen_parse(char *value, struct mk_server *server)
{
    int ret = -1;
    int flags = 0;
    long port_num;
    char *address = NULL;
    char *port = NULL;
    char *divider;
    struct mk_list *list = NULL;
    struct mk_string_line *listener;

    list = mk_string_split_line(value);
    if (!list) {
        goto error;
    }

    if (mk_list_is_empty(list) == 0) {
        goto error;
    }

    /* Parse the listener interface */
    listener = mk_list_entry_first(list, struct mk_string_line, _head);
    if (listener->val[0] == '[') {
        /* IPv6 address */
        divider = strchr(listener->val, ']');
        if (divider == NULL) {
            mk_err("[config] Expected closing ']' in IPv6 address.");
            goto error;
        }
        if (divider[1] != ':' || divider[2] == '\0') {
            mk_err("[config] Expected ':port' after IPv6 address.");
            goto error;
        }

        address = mk_string_copy_substr(listener->val + 1, 0,
                                        divider - listener->val - 1);
        port = mk_string_dup(divider + 2);
    }
    else if (strchr(listener->val, ':') != NULL) {
        /* IPv4 address */
        divider = strrchr(listener->val, ':');
        if (divider == NULL || divider[1] == '\0') {
            mk_err("[config] Expected ':port' after IPv4 address.");
            goto error;
        }

        address = mk_string_copy_substr(listener->val, 0,
                                        divider - listener->val);
        port = mk_string_dup(divider + 1);
    }
    else {
        /* Port only */
        address = NULL;
        port = mk_string_dup(listener->val);
    }

    errno = 0;
    port_num = strtol(port, NULL, 10);
    if (errno != 0 || port_num == LONG_MAX || port_num == LONG_MIN) {
        mk_warn("Using defaults, could not understand \"Listen %s\"",
                listener->val);
        port = NULL;
    }

    /* Check extra properties of the listener */
    flags = MK_CAP_HTTP;
    if (mk_config_key_have(list, "!http")) {
        flags |= ~MK_CAP_HTTP;
    }

#ifdef MK_HAVE_HTTP2
    if (mk_config_key_have(list, "h2")) {
        flags |= (MK_CAP_HTTP2 | MK_CAP_SOCK_TLS);
    }

    if (mk_config_key_have(list, "h2c")) {
        flags |= MK_CAP_HTTP2;
    }
#endif

    if (mk_config_key_have(list, "tls")) {
        flags |= MK_CAP_SOCK_TLS;
    }

    /* register the new listener */
    mk_config_listener_add(address, port, flags, server);
    mk_string_split_free(list);
    list = NULL;
    ret = 0;

error:
    if (address) {
        mk_mem_free(address);
    }
    if (port) {
        mk_mem_free(port);
    }
    if (list) {
        mk_string_split_free(list);
    }

    return ret;
}